

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_is_book_k(object_kind *kind)

{
  object_kind *kind_local;
  
  return kind->tval - 0x1eU < 5;
}

Assistant:

bool tval_is_book_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_MAGIC_BOOK:
		case TV_PRAYER_BOOK:
		case TV_NATURE_BOOK:
		case TV_SHADOW_BOOK:
		case TV_OTHER_BOOK:
			return true;
		default:
			return false;
	}
}